

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParameterManager.hpp
# Opt level: O0

string * __thiscall
Parameter<std::vector<double,std::allocator<double>>>::getParamType_abi_cxx11_
          (Parameter<std::vector<double,_std::allocator<double>_>_> *this)

{
  string *in_RDI;
  
  ParameterTraits<std::vector<double,std::allocator<double>>>::getParamType_abi_cxx11_();
  return in_RDI;
}

Assistant:

virtual std::string getParamType() {
    return ParameterTraits<ParamType>::getParamType();
  }